

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_subquery.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformRangeSubselect(Transformer *this,PGRangeSubselect *root)

{
  PGAlias *root_00;
  undefined8 __p;
  pointer pSVar1;
  long in_RDX;
  optional_ptr<duckdb::Transformer,_true> local_120;
  undefined1 local_118 [8];
  undefined1 local_110 [32];
  Transformer subquery_transformer;
  
  Transformer(&subquery_transformer,(Transformer *)root);
  TransformSelectStmt((Transformer *)local_118,(PGNode *)&subquery_transformer,
                      SUB81(*(undefined8 *)(in_RDX + 8),0));
  if (local_118 == (undefined1  [8])0x0) {
    (this->parent).ptr = (Transformer *)0x0;
  }
  else {
    make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
              ((duckdb *)&local_120,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)local_118);
    root_00 = *(PGAlias **)(in_RDX + 0x10);
    pSVar1 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
             operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                         *)&local_120);
    TransformAlias((string *)local_110,(Transformer *)root,root_00,
                   &(pSVar1->super_TableRef).column_name_alias);
    pSVar1 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
             operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                         *)&local_120);
    ::std::__cxx11::string::operator=((string *)&(pSVar1->super_TableRef).alias,(string *)local_110)
    ;
    ::std::__cxx11::string::~string((string *)local_110);
    if (*(long *)(in_RDX + 0x18) != 0) {
      TransformSampleOptions
                ((Transformer *)local_110,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pSVar1 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
               operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                           *)&local_120);
      __p = local_110._0_8_;
      local_110._0_8_ = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
      reset((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
            &(pSVar1->super_TableRef).sample,(pointer)__p);
      ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
      ~unique_ptr((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
                  local_110);
    }
    (this->parent).ptr = local_120.ptr;
    if (local_118 != (undefined1  [8])0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_118)->ptr->options)();
    }
  }
  ~Transformer(&subquery_transformer);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformRangeSubselect(duckdb_libpgquery::PGRangeSubselect &root) {
	Transformer subquery_transformer(*this);
	auto subquery = subquery_transformer.TransformSelectStmt(*root.subquery);
	if (!subquery) {
		return nullptr;
	}
	auto result = make_uniq<SubqueryRef>(std::move(subquery));
	result->alias = TransformAlias(root.alias, result->column_name_alias);
	if (root.sample) {
		result->sample = TransformSampleOptions(root.sample);
	}
	return std::move(result);
}